

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void config_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  fdb_config *__ptr;
  size_t metalen;
  size_t bodylen;
  char *unaff_RBX;
  fdb_config *pfVar4;
  uint uVar5;
  ulong unaff_RBP;
  char *pcVar6;
  fdb_file_info *unaff_R12;
  fdb_file_handle **ptr_fhandle;
  ulong uVar7;
  fdb_kvs_handle *unaff_R13;
  char *unaff_R14;
  fdb_kvs_handle **unaff_R15;
  char *kvs_config;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  timeval __test_begin;
  fdb_config fconfig;
  fdb_file_info finfo;
  char fname [256];
  fdb_doc *pfStack_16d0;
  fdb_kvs_handle *pfStack_16c8;
  fdb_file_handle *pfStack_16c0;
  timeval tStack_16b8;
  fdb_kvs_config fStack_16a8;
  fdb_config fStack_1690;
  char acStack_1598 [256];
  char *pcStack_1498;
  fdb_config *pfStack_1490;
  fdb_config *pfStack_1488;
  fdb_file_handle *pfStack_1478;
  fdb_kvs_handle *pfStack_1470;
  fdb_kvs_config fStack_1468;
  timeval tStack_1450;
  char acStack_1440 [264];
  fdb_config fStack_1338;
  char acStack_1240 [256];
  char acStack_1140 [264];
  char *pcStack_1038;
  fdb_file_handle **ppfStack_1030;
  fdb_kvs_handle *pfStack_1028;
  fdb_config *pfStack_1020;
  fdb_kvs_config *pfStack_1018;
  code *pcStack_1010;
  fdb_kvs_handle *pfStack_ff8;
  fdb_file_handle *pfStack_ff0;
  fdb_iterator *pfStack_fe8;
  timeval tStack_fe0;
  fdb_kvs_config fStack_fd0;
  fdb_file_handle *apfStack_fb8 [32];
  fdb_config fStack_eb8;
  fdb_config fStack_db0;
  char acStack_cb8 [264];
  fdb_config *pfStack_bb0;
  fdb_file_info *pfStack_ba8;
  fdb_kvs_handle *pfStack_ba0;
  fdb_config *pfStack_b98;
  fdb_kvs_handle **ppfStack_b90;
  code *pcStack_b88;
  fdb_file_handle *pfStack_b78;
  fdb_kvs_handle *pfStack_b70;
  fdb_doc *pfStack_b68;
  undefined1 auStack_b60 [40];
  fdb_seqnum_t fStack_b38;
  uint64_t uStack_b30;
  void *pvStack_b28;
  fdb_config *pfStack_b20;
  uint64_t uStack_b18;
  fdb_kvs_config fStack_b10;
  timeval tStack_af8;
  undefined1 auStack_ae8 [72];
  fdb_config fStack_aa0;
  char acStack_9a0 [256];
  fdb_config fStack_8a0;
  fdb_config *pfStack_7a8;
  fdb_config *pfStack_7a0;
  fdb_doc *pfStack_790;
  fdb_kvs_handle *pfStack_788;
  fdb_file_handle *pfStack_780;
  undefined1 auStack_778 [40];
  fdb_seqnum_t fStack_750;
  uint64_t uStack_748;
  void *pvStack_740;
  fdb_config *pfStack_738;
  uint64_t uStack_730;
  fdb_kvs_config fStack_720;
  timeval tStack_708;
  uint8_t auStack_6f8 [256];
  fdb_config fStack_5f8;
  fdb_config fStack_4f8;
  fdb_config *pfStack_400;
  fdb_config *pfStack_3f8;
  fdb_file_handle *pfStack_3e8;
  fdb_kvs_handle *pfStack_3e0;
  size_t sStack_3d8;
  int *piStack_3d0;
  timeval tStack_3c8;
  fdb_config fStack_3b8;
  code *pcStack_2c0;
  fdb_file_handle *local_2b0;
  fdb_kvs_handle *local_2a8;
  fdb_kvs_config local_2a0;
  timeval local_288;
  fdb_config local_278;
  fdb_file_info local_180;
  char local_138 [264];
  
  pcStack_2c0 = (code *)0x110054;
  gettimeofday(&local_288,(__timezone_ptr_t)0x0);
  pcStack_2c0 = (code *)0x110059;
  memleak_start();
  pcStack_2c0 = (code *)0x110065;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_2c0 = (code *)0x11006a;
  sVar2 = fdb_get_buffer_cache_used();
  if (sVar2 == 0) {
    unaff_RBX = local_138;
    pcStack_2c0 = (code *)0x110083;
    fdb_get_default_config();
    unaff_R14 = (char *)&local_278;
    pcStack_2c0 = (code *)0x110098;
    memcpy(unaff_R14,unaff_RBX,0xf8);
    local_278.buffercache_size = 0xffffffffffffffff;
    pcStack_2c0 = (code *)0x1100b4;
    fVar1 = fdb_open(&local_2b0,"./dummy1",(fdb_config *)unaff_R14);
    if (fVar1 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) goto LAB_0011030f;
    unaff_RBX = local_138;
    pcStack_2c0 = (code *)0x1100cd;
    fdb_get_default_config();
    unaff_R14 = (char *)&local_278;
    pcStack_2c0 = (code *)0x1100e2;
    memcpy(unaff_R14,unaff_RBX,0xf8);
    local_278.max_writer_lock_prob = 0x78;
    pcStack_2c0 = (code *)0x1100fe;
    fVar1 = fdb_open(&local_2b0,"./dummy1",(fdb_config *)unaff_R14);
    if (fVar1 != FDB_RESULT_INVALID_CONFIG) goto LAB_00110314;
    unaff_RBX = local_138;
    pcStack_2c0 = (code *)0x110117;
    fdb_get_default_config();
    pcStack_2c0 = (code *)0x110129;
    memcpy(&local_278,unaff_RBX,0xf8);
    pcStack_2c0 = (code *)0x110133;
    fdb_get_default_kvs_config();
    unaff_RBP = 4;
    unaff_R14 = "justonekv";
    unaff_R15 = &local_2a8;
    unaff_R12 = &local_180;
    do {
      pcStack_2c0 = (code *)0x11015f;
      sprintf(unaff_RBX,"dummy%d",unaff_RBP);
      pcStack_2c0 = (code *)0x110171;
      fVar1 = fdb_open(&local_2b0,unaff_RBX,&local_278);
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_001102fb:
        pcStack_2c0 = (code *)0x110300;
        config_test();
LAB_00110300:
        pcStack_2c0 = (code *)0x110305;
        config_test();
LAB_00110305:
        pcStack_2c0 = (code *)0x11030a;
        config_test();
        goto LAB_0011030a;
      }
      pcStack_2c0 = (code *)0x11018e;
      fVar1 = fdb_kvs_open(local_2b0,unaff_R15,"justonekv",&local_2a0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStack_2c0 = (code *)0x1102fb;
        config_test();
        goto LAB_001102fb;
      }
      pcStack_2c0 = (code *)0x11019b;
      unaff_R13 = (fdb_kvs_handle *)fdb_get_buffer_cache_used();
      pcStack_2c0 = (code *)0x1101ab;
      fVar1 = fdb_get_file_info(local_2b0,unaff_R12);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110305;
      if (local_180.file_size != local_278.blocksize * 7) {
        pcStack_2c0 = (code *)0x110203;
        config_test();
      }
      if (unaff_R13 != (fdb_kvs_handle *)(ulong)(local_278.blocksize * 2)) {
        pcStack_2c0 = (code *)0x110212;
        config_test();
      }
      pcStack_2c0 = (code *)0x1101df;
      fVar1 = fdb_close(local_2b0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110300;
      uVar5 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar5;
    } while (uVar5 != 0);
    pcStack_2c0 = (code *)0x11022b;
    fVar1 = fdb_open(&local_2b0,local_138,&local_278);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110319;
    pcStack_2c0 = (code *)0x11024e;
    fVar1 = fdb_kvs_open(local_2b0,&local_2a8,"justonekv",&local_2a0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011031e;
    pcStack_2c0 = (code *)0x110279;
    fVar1 = fdb_set_kv(local_2a8,"key",3,"body",5);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_2c0 = (code *)0x110286;
      sVar2 = fdb_get_buffer_cache_used();
      if (sVar2 != local_278.blocksize << 3) {
        pcStack_2c0 = (code *)0x11029f;
        config_test();
      }
      pcStack_2c0 = (code *)0x1102a9;
      fdb_close(local_2b0);
      pcStack_2c0 = (code *)0x1102ae;
      fdb_shutdown();
      pcStack_2c0 = (code *)0x1102b3;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (config_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pcStack_2c0 = (code *)0x1102e4;
      fprintf(_stderr,pcVar6,"forestdb config test");
      return;
    }
  }
  else {
LAB_0011030a:
    pcStack_2c0 = (code *)0x11030f;
    config_test();
LAB_0011030f:
    pcStack_2c0 = (code *)0x110314;
    config_test();
LAB_00110314:
    pcStack_2c0 = (code *)0x110319;
    config_test();
LAB_00110319:
    pcStack_2c0 = (code *)0x11031e;
    config_test();
LAB_0011031e:
    pcStack_2c0 = (code *)0x110323;
    config_test();
  }
  pcStack_2c0 = delete_reopen_test;
  config_test();
  pfStack_3f8 = (fdb_config *)0x11033c;
  pcStack_2c0 = (code *)unaff_RBX;
  gettimeofday(&tStack_3c8,(__timezone_ptr_t)0x0);
  pfStack_3f8 = (fdb_config *)0x110341;
  memleak_start();
  pfStack_3f8 = (fdb_config *)0x11034d;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_3f8 = (fdb_config *)0x11035a;
  fdb_get_default_config();
  fStack_3b8.buffercache_size = 0;
  fStack_3b8.num_compactor_threads = 1;
  pfStack_3f8 = (fdb_config *)0x11037e;
  fVar1 = fdb_open(&pfStack_3e8,"./dummy3",&fStack_3b8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_3f8 = (fdb_config *)0x110397;
    fVar1 = fdb_kvs_open_default(pfStack_3e8,&pfStack_3e0,(fdb_kvs_config *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011058e;
    pfStack_3f8 = (fdb_config *)0x1103ae;
    fVar1 = fdb_begin_transaction(pfStack_3e8,'\x02');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110593;
    pfStack_3f8 = (fdb_config *)0x1103d9;
    fVar1 = fdb_set_kv(pfStack_3e0,"foo",3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110598;
    pfStack_3f8 = (fdb_config *)0x1103ed;
    fVar1 = fdb_end_transaction(pfStack_3e8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011059d;
    pfStack_3f8 = (fdb_config *)0x110415;
    fVar1 = fdb_get_kv(pfStack_3e0,"foo",3,&piStack_3d0,&sStack_3d8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001105a2;
    if (sStack_3d8 != 5) {
      pfStack_3f8 = (fdb_config *)0x11042f;
      delete_reopen_test();
    }
    if ((char)piStack_3d0[1] != 'e' || *piStack_3d0 != 0x756c6176) goto LAB_001105a7;
    pfStack_3f8 = (fdb_config *)0x11044f;
    fdb_free_block(piStack_3d0);
    pfStack_3f8 = (fdb_config *)0x11045e;
    fVar1 = fdb_begin_transaction(pfStack_3e8,'\x02');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001105ac;
    pfStack_3f8 = (fdb_config *)0x11047c;
    fVar1 = fdb_del_kv(pfStack_3e0,"foo",3);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001105b1;
    pfStack_3f8 = (fdb_config *)0x110490;
    fVar1 = fdb_end_transaction(pfStack_3e8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001105b6;
    pfStack_3f8 = (fdb_config *)0x1104b8;
    fVar1 = fdb_get_kv(pfStack_3e0,"foo",3,&piStack_3d0,&sStack_3d8);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105bb;
    pfStack_3f8 = (fdb_config *)0x1104cb;
    fVar1 = fdb_close(pfStack_3e8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001105c0;
    pfStack_3f8 = (fdb_config *)0x1104e9;
    fVar1 = fdb_open(&pfStack_3e8,"./dummy3",&fStack_3b8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001105c5;
    pfStack_3f8 = (fdb_config *)0x110502;
    fVar1 = fdb_kvs_open_default(pfStack_3e8,&pfStack_3e0,(fdb_kvs_config *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001105ca;
    pfStack_3f8 = (fdb_config *)0x11052a;
    fVar1 = fdb_get_kv(pfStack_3e0,"foo",3,&piStack_3d0,&sStack_3d8);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105cf;
    pfStack_3f8 = (fdb_config *)0x11053d;
    fVar1 = fdb_close(pfStack_3e8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_3f8 = (fdb_config *)0x11054a;
      fdb_shutdown();
      pfStack_3f8 = (fdb_config *)0x11054f;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_3f8 = (fdb_config *)0x110580;
      fprintf(_stderr,pcVar6,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    pfStack_3f8 = (fdb_config *)0x11058e;
    delete_reopen_test();
LAB_0011058e:
    pfStack_3f8 = (fdb_config *)0x110593;
    delete_reopen_test();
LAB_00110593:
    pfStack_3f8 = (fdb_config *)0x110598;
    delete_reopen_test();
LAB_00110598:
    pfStack_3f8 = (fdb_config *)0x11059d;
    delete_reopen_test();
LAB_0011059d:
    pfStack_3f8 = (fdb_config *)0x1105a2;
    delete_reopen_test();
LAB_001105a2:
    pfStack_3f8 = (fdb_config *)0x1105a7;
    delete_reopen_test();
LAB_001105a7:
    pfStack_3f8 = (fdb_config *)0x1105ac;
    delete_reopen_test();
LAB_001105ac:
    pfStack_3f8 = (fdb_config *)0x1105b1;
    delete_reopen_test();
LAB_001105b1:
    pfStack_3f8 = (fdb_config *)0x1105b6;
    delete_reopen_test();
LAB_001105b6:
    pfStack_3f8 = (fdb_config *)0x1105bb;
    delete_reopen_test();
LAB_001105bb:
    pfStack_3f8 = (fdb_config *)0x1105c0;
    delete_reopen_test();
LAB_001105c0:
    pfStack_3f8 = (fdb_config *)0x1105c5;
    delete_reopen_test();
LAB_001105c5:
    pfStack_3f8 = (fdb_config *)0x1105ca;
    delete_reopen_test();
LAB_001105ca:
    pfStack_3f8 = (fdb_config *)0x1105cf;
    delete_reopen_test();
LAB_001105cf:
    pfStack_3f8 = (fdb_config *)0x1105d4;
    delete_reopen_test();
  }
  pfStack_3f8 = (fdb_config *)deleted_doc_get_api_test;
  delete_reopen_test();
  pfStack_7a0 = (fdb_config *)0x1105f2;
  pfStack_400 = &fStack_3b8;
  pfStack_3f8 = (fdb_config *)unaff_R14;
  gettimeofday(&tStack_708,(__timezone_ptr_t)0x0);
  pfStack_7a0 = (fdb_config *)0x1105f7;
  memleak_start();
  pfStack_7a0 = (fdb_config *)0x110603;
  system("rm -rf  dummy* > errorlog.txt");
  uStack_730 = 0;
  auStack_778._0_8_ = 0;
  auStack_778._8_8_ = 0;
  auStack_778._16_8_ = 0;
  auStack_778._24_8_ = 0;
  uStack_748 = 0;
  pvStack_740 = (void *)0x0;
  auStack_778._32_8_ = auStack_6f8;
  pfStack_738 = &fStack_5f8;
  fStack_750 = 0xffffffffffffffff;
  pfVar4 = &fStack_4f8;
  pfStack_7a0 = (fdb_config *)0x110652;
  fdb_get_default_config();
  fStack_4f8.purging_interval = 1;
  fStack_4f8.seqtree_opt = '\x01';
  pfStack_7a0 = (fdb_config *)0x110667;
  fdb_get_default_kvs_config();
  pfStack_7a0 = (fdb_config *)0x11067b;
  fVar1 = fdb_open(&pfStack_780,"./dummy1",pfVar4);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_7a0 = (fdb_config *)0x110699;
    fVar1 = fdb_kvs_open(pfStack_780,&pfStack_788,(char *)0x0,&fStack_720);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108c4;
    builtin_memcpy(auStack_6f8,"key",4);
    pfVar4 = &fStack_5f8;
    fStack_5f8.chunksize = 0x6f62;
    fStack_5f8._2_2_ = 0x7964;
    fStack_5f8.blocksize._0_1_ = 0;
    pfStack_7a0 = (fdb_config *)0x1106c6;
    auStack_778._0_8_ = strlen((char *)auStack_6f8);
    unaff_R14 = auStack_778;
    pfStack_7a0 = (fdb_config *)0x1106d6;
    auStack_778._16_8_ = strlen((char *)pfVar4);
    pfStack_7a0 = (fdb_config *)0x1106e7;
    fVar1 = fdb_set(pfStack_788,(fdb_doc *)unaff_R14);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108c9;
    pfStack_7a0 = (fdb_config *)0x1106fe;
    fVar1 = fdb_commit(pfStack_780,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    pfStack_7a0 = (fdb_config *)0x110715;
    fVar1 = fdb_del(pfStack_788,(fdb_doc *)auStack_778);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d3;
    pfStack_7a0 = (fdb_config *)0x11072c;
    fVar1 = fdb_commit(pfStack_780,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pfVar4 = (fdb_config *)&pfStack_790;
    pfStack_7a0 = (fdb_config *)0x11075e;
    fdb_doc_create((fdb_doc **)pfVar4,auStack_6f8,auStack_778._0_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a0 = (fdb_config *)0x11076b;
    fVar1 = fdb_get_metaonly(pfStack_788,pfStack_790);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    if (pfStack_790->deleted == false) {
      pfStack_7a0 = (fdb_config *)0x110788;
      deleted_doc_get_api_test();
    }
    pfStack_790->deleted = false;
    pfStack_7a0 = (fdb_config *)0x11079b;
    fVar1 = fdb_get_metaonly_byseq(pfStack_788,pfStack_790);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108e2;
    if (pfStack_790->deleted == false) {
      pfStack_7a0 = (fdb_config *)0x1107b8;
      deleted_doc_get_api_test();
    }
    pfStack_790->deleted = false;
    pfStack_7a0 = (fdb_config *)0x1107cb;
    fVar1 = fdb_get_byoffset(pfStack_788,pfStack_790);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108e7;
    if (pfStack_790->deleted == false) {
      pfStack_7a0 = (fdb_config *)0x1107e9;
      deleted_doc_get_api_test();
    }
    pfStack_790->deleted = false;
    pfStack_7a0 = (fdb_config *)0x1107fc;
    fVar1 = fdb_get(pfStack_788,pfStack_790);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ec;
    if (pfStack_790->deleted == true) {
      pfStack_7a0 = (fdb_config *)0x11081a;
      deleted_doc_get_api_test();
    }
    pfStack_790->deleted = false;
    pfStack_7a0 = (fdb_config *)0x11082d;
    fVar1 = fdb_get_byseq(pfStack_788,pfStack_790);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f1;
    if (pfStack_790->deleted == true) {
      pfStack_7a0 = (fdb_config *)0x11084b;
      deleted_doc_get_api_test();
    }
    pfStack_7a0 = (fdb_config *)0x110855;
    fdb_doc_free(pfStack_790);
    pfStack_7a0 = (fdb_config *)0x11085f;
    fVar1 = fdb_kvs_close(pfStack_788);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108f6;
    pfStack_7a0 = (fdb_config *)0x110871;
    fVar1 = fdb_close(pfStack_780);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_7a0 = (fdb_config *)0x11087e;
      fdb_shutdown();
      pfStack_7a0 = (fdb_config *)0x110883;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_7a0 = (fdb_config *)0x1108b4;
      fprintf(_stderr,pcVar6,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_7a0 = (fdb_config *)0x1108c4;
    deleted_doc_get_api_test();
LAB_001108c4:
    pfStack_7a0 = (fdb_config *)0x1108c9;
    deleted_doc_get_api_test();
LAB_001108c9:
    pfStack_7a0 = (fdb_config *)0x1108ce;
    deleted_doc_get_api_test();
LAB_001108ce:
    pfStack_7a0 = (fdb_config *)0x1108d3;
    deleted_doc_get_api_test();
LAB_001108d3:
    pfStack_7a0 = (fdb_config *)0x1108d8;
    deleted_doc_get_api_test();
LAB_001108d8:
    pfStack_7a0 = (fdb_config *)0x1108dd;
    deleted_doc_get_api_test();
LAB_001108dd:
    pfStack_7a0 = (fdb_config *)0x1108e2;
    deleted_doc_get_api_test();
LAB_001108e2:
    pfStack_7a0 = (fdb_config *)0x1108e7;
    deleted_doc_get_api_test();
LAB_001108e7:
    pfStack_7a0 = (fdb_config *)0x1108ec;
    deleted_doc_get_api_test();
LAB_001108ec:
    pfStack_7a0 = (fdb_config *)0x1108f1;
    deleted_doc_get_api_test();
LAB_001108f1:
    pfStack_7a0 = (fdb_config *)0x1108f6;
    deleted_doc_get_api_test();
LAB_001108f6:
    pfStack_7a0 = (fdb_config *)0x1108fb;
    deleted_doc_get_api_test();
  }
  pfStack_7a0 = (fdb_config *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pcStack_b88 = (code *)0x110919;
  pfStack_7a8 = pfVar4;
  pfStack_7a0 = (fdb_config *)unaff_R14;
  gettimeofday(&tStack_af8,(__timezone_ptr_t)0x0);
  pcStack_b88 = (code *)0x11091e;
  memleak_start();
  pcStack_b88 = (code *)0x11092a;
  system("rm -rf  dummy* > errorlog.txt");
  uStack_b18 = 0;
  auStack_b60._0_8_ = 0;
  auStack_b60._8_8_ = 0;
  auStack_b60._16_8_ = 0;
  auStack_b60._24_8_ = 0;
  uStack_b30 = 0;
  pvStack_b28 = (void *)0x0;
  auStack_b60._32_8_ = acStack_9a0;
  pfStack_b20 = &fStack_aa0;
  fStack_b38 = 0xffffffffffffffff;
  pfVar4 = &fStack_8a0;
  pcStack_b88 = (code *)0x110979;
  fdb_get_default_config();
  fStack_8a0.purging_interval = 0;
  pcStack_b88 = (code *)0x11098a;
  fdb_get_default_kvs_config();
  pcStack_b88 = (code *)0x11099e;
  fVar1 = fdb_open(&pfStack_b78,"./dummy1",pfVar4);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_b88 = (code *)0x1109c1;
    fVar1 = fdb_kvs_open(pfStack_b78,&pfStack_b70,"main",&fStack_b10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b41;
    acStack_9a0[0] = 'K';
    acStack_9a0[1] = '\0';
    pfVar4 = &fStack_aa0;
    fStack_aa0.chunksize = 0x6f62;
    fStack_aa0._2_2_ = 0x7964;
    fStack_aa0.blocksize._0_1_ = 0;
    pcStack_b88 = (code *)0x1109ed;
    sVar3 = strlen(acStack_9a0);
    auStack_b60._0_8_ = sVar3 + 1;
    unaff_R14 = auStack_b60;
    pcStack_b88 = (code *)0x110a00;
    sVar3 = strlen((char *)pfVar4);
    auStack_b60._16_8_ = sVar3 + 1;
    pcStack_b88 = (code *)0x110a14;
    fVar1 = fdb_set(pfStack_b70,(fdb_doc *)unaff_R14);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b46;
    pcStack_b88 = (code *)0x110a2b;
    fVar1 = fdb_del(pfStack_b70,(fdb_doc *)auStack_b60);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b4b;
    pfVar4 = (fdb_config *)&pfStack_b68;
    pcStack_b88 = (code *)0x110a5a;
    fdb_doc_create((fdb_doc **)pfVar4,(void *)auStack_b60._32_8_,auStack_b60._0_8_,(void *)0x0,0,
                   (void *)0x0,0);
    pcStack_b88 = (code *)0x110a67;
    fVar1 = fdb_get(pfStack_b70,pfStack_b68);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b50;
    pcStack_b88 = (code *)0x110a7a;
    fdb_doc_free(pfStack_b68);
    pcStack_b88 = (code *)0x110a8c;
    fdb_get_file_info(pfStack_b78,(fdb_file_info *)auStack_ae8);
    pfVar4 = (fdb_config *)(auStack_ae8 + 0x10);
    if (auStack_ae8._16_8_ != 0) {
      pcStack_b88 = (code *)0x110aa2;
      deleted_doc_stat_test();
    }
    pcStack_b88 = (code *)0x110aae;
    fVar1 = fdb_commit(pfStack_b78,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b55;
    unaff_R14 = auStack_ae8;
    pcStack_b88 = (code *)0x110acb;
    fdb_get_file_info(pfStack_b78,(fdb_file_info *)unaff_R14);
    if (auStack_ae8._16_8_ != 0) {
      pcStack_b88 = (code *)0x110ada;
      deleted_doc_stat_test();
    }
    pcStack_b88 = (code *)0x110ae4;
    fVar1 = fdb_kvs_close(pfStack_b70);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b5a;
    pcStack_b88 = (code *)0x110af2;
    fVar1 = fdb_close(pfStack_b78);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_b88 = (code *)0x110afb;
      fdb_shutdown();
      pcStack_b88 = (code *)0x110b00;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pcStack_b88 = (code *)0x110b31;
      fprintf(_stderr,pcVar6,"deleted doc stat test");
      return;
    }
  }
  else {
    pcStack_b88 = (code *)0x110b41;
    deleted_doc_stat_test();
LAB_00110b41:
    pcStack_b88 = (code *)0x110b46;
    deleted_doc_stat_test();
LAB_00110b46:
    pcStack_b88 = (code *)0x110b4b;
    deleted_doc_stat_test();
LAB_00110b4b:
    pcStack_b88 = (code *)0x110b50;
    deleted_doc_stat_test();
LAB_00110b50:
    pcStack_b88 = (code *)0x110b55;
    deleted_doc_stat_test();
LAB_00110b55:
    pcStack_b88 = (code *)0x110b5a;
    deleted_doc_stat_test();
LAB_00110b5a:
    pcStack_b88 = (code *)0x110b5f;
    deleted_doc_stat_test();
  }
  pcStack_b88 = complete_delete_test;
  deleted_doc_stat_test();
  pcStack_1010 = (code *)0x110b81;
  pfStack_bb0 = pfVar4;
  pfStack_ba8 = unaff_R12;
  pfStack_ba0 = unaff_R13;
  pfStack_b98 = (fdb_config *)unaff_R14;
  ppfStack_b90 = unaff_R15;
  pcStack_b88 = (code *)unaff_RBP;
  gettimeofday(&tStack_fe0,(__timezone_ptr_t)0x0);
  pcStack_1010 = (code *)0x110b86;
  memleak_start();
  pcVar6 = acStack_cb8;
  builtin_strncpy(acStack_cb8,"./dummy1",9);
  pcStack_1010 = (code *)0x110bab;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar4 = &fStack_db0;
  pcStack_1010 = (code *)0x110bbb;
  fdb_get_default_config();
  fStack_db0.buffercache_size = 0;
  kvs_config = &fStack_fd0.create_if_missing;
  pcStack_1010 = (code *)0x110bd0;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_ff0;
  pcStack_1010 = (code *)0x110be3;
  fdb_open(ptr_fhandle,pcVar6,pfVar4);
  pcStack_1010 = (code *)0x110bfb;
  fVar1 = fdb_kvs_open(pfStack_ff0,&pfStack_ff8,"db1",(fdb_kvs_config *)kvs_config);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110d95;
  unaff_RBP = 0;
  do {
    pcStack_1010 = (code *)0x110c2c;
    sprintf((char *)&fStack_eb8,"key%05d",unaff_RBP);
    pcStack_1010 = (code *)0x110c3b;
    sprintf((char *)apfStack_fb8,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_ff8;
    pcStack_1010 = (code *)0x110c48;
    sVar3 = strlen((char *)&fStack_eb8);
    pcVar6 = (char *)(sVar3 + 1);
    pcStack_1010 = (code *)0x110c54;
    sVar3 = strlen((char *)apfStack_fb8);
    pcStack_1010 = (code *)0x110c69;
    fVar1 = fdb_set_kv(unaff_R13,&fStack_eb8,(size_t)pcVar6,apfStack_fb8,sVar3 + 1);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_1010 = (code *)0x110d90;
      complete_delete_test();
      goto LAB_00110d90;
    }
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_1010 = (code *)0x110c8a;
  fdb_commit(pfStack_ff0,'\x01');
  pcVar6 = "key%05d";
  pfVar4 = &fStack_eb8;
  kvs_config = "value%05d";
  ptr_fhandle = apfStack_fb8;
  unaff_RBP = 0;
  do {
    pcStack_1010 = (code *)0x110cb6;
    sprintf((char *)pfVar4,"key%05d",unaff_RBP);
    pcStack_1010 = (code *)0x110cc5;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_ff8;
    pcStack_1010 = (code *)0x110cd2;
    sVar3 = strlen((char *)pfVar4);
    pcStack_1010 = (code *)0x110ce1;
    fVar1 = fdb_del_kv(unaff_R13,pfVar4,sVar3 + 1);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110d90;
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_1010 = (code *)0x110d02;
  fdb_commit(pfStack_ff0,'\x01');
  pcStack_1010 = (code *)0x110d22;
  fVar1 = fdb_iterator_init(pfStack_ff8,&pfStack_fe8,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110d9a;
  pcStack_1010 = (code *)0x110d30;
  fVar1 = fdb_iterator_close(pfStack_fe8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_1010 = (code *)0x110d3e;
    fdb_close(pfStack_ff0);
    pcStack_1010 = (code *)0x110d43;
    fdb_shutdown();
    pcStack_1010 = (code *)0x110d48;
    memleak_end();
    pcVar6 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    pcStack_1010 = (code *)0x110d79;
    fprintf(_stderr,pcVar6,"complete delete");
    return;
  }
  goto LAB_00110d9f;
LAB_00110d90:
  pfVar4 = &fStack_eb8;
  ptr_fhandle = apfStack_fb8;
  kvs_config = "value%05d";
  pcStack_1010 = (code *)0x110d95;
  complete_delete_test();
LAB_00110d95:
  pcStack_1010 = (code *)0x110d9a;
  complete_delete_test();
LAB_00110d9a:
  pcStack_1010 = (code *)0x110d9f;
  complete_delete_test();
LAB_00110d9f:
  pcStack_1010 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_1488 = (fdb_config *)0x110dc1;
  pcStack_1038 = pcVar6;
  ppfStack_1030 = ptr_fhandle;
  pfStack_1028 = unaff_R13;
  pfStack_1020 = pfVar4;
  pfStack_1018 = (fdb_kvs_config *)kvs_config;
  pcStack_1010 = (code *)unaff_RBP;
  gettimeofday(&tStack_1450,(__timezone_ptr_t)0x0);
  pfStack_1488 = (fdb_config *)0x110dc6;
  memleak_start();
  pfStack_1488 = (fdb_config *)0x110dd0;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_1488 = (fdb_config *)0x110ddf;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar4 = &fStack_1338;
  pfStack_1488 = (fdb_config *)0x110def;
  fdb_get_default_config();
  pfStack_1488 = (fdb_config *)0x110df9;
  fdb_get_default_kvs_config();
  pfStack_1488 = (fdb_config *)0x110e0d;
  fVar1 = fdb_open(&pfStack_1478,"./dummy1",pfVar4);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_1488 = (fdb_config *)0x110e2b;
    fVar1 = fdb_kvs_open(pfStack_1478,&pfStack_1470,(char *)0x0,&fStack_1468);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110fb0;
    pcVar6 = (char *)0x0;
    uVar7 = 0;
    do {
      pfStack_1488 = (fdb_config *)0x110e54;
      sprintf(acStack_1140,"key%128d",uVar7 & 0xffffffff);
      pfStack_1488 = (fdb_config *)0x110e70;
      sprintf(acStack_1240,"meta%128d",uVar7 & 0xffffffff);
      pfStack_1488 = (fdb_config *)0x110e86;
      sprintf(acStack_1440,"body%128d",uVar7 & 0xffffffff);
      pfStack_1488 = (fdb_config *)0x110e92;
      sVar3 = strlen(acStack_1140);
      pfStack_1488 = (fdb_config *)0x110ea0;
      metalen = strlen(acStack_1240);
      pfStack_1488 = (fdb_config *)0x110ead;
      bodylen = strlen(acStack_1440);
      pfStack_1488 = (fdb_config *)0x110ed7;
      fdb_doc_create((fdb_doc **)(pcVar6 + (long)&__ptr->chunksize),acStack_1140,sVar3,acStack_1240,
                     metalen,acStack_1440,bodylen);
      pfStack_1488 = (fdb_config *)0x110ee5;
      fdb_set(pfStack_1470,*(fdb_doc **)(&__ptr->chunksize + uVar7 * 4));
      pfStack_1488 = (fdb_config *)0x110eee;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar7 * 4));
      uVar7 = uVar7 + 1;
      pcVar6 = pcVar6 + 8;
    } while (uVar7 != 500000);
    pfStack_1488 = (fdb_config *)0x110f0c;
    fVar1 = fdb_kvs_close(pfStack_1470);
    pfVar4 = __ptr;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110fb5;
    pfStack_1488 = (fdb_config *)0x110f1e;
    fVar1 = fdb_close(pfStack_1478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110fba;
    pfStack_1488 = (fdb_config *)0x110f3f;
    fVar1 = fdb_open(&pfStack_1478,"./dummy1",&fStack_1338);
    if (fVar1 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f56:
      pfStack_1488 = (fdb_config *)0x110f5e;
      free(__ptr);
      pfStack_1488 = (fdb_config *)0x110f63;
      fdb_shutdown();
      pfStack_1488 = (fdb_config *)0x110f68;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_1488 = (fdb_config *)0x110f99;
      fprintf(_stderr,pcVar6,"large batch write test with no commits");
      return;
    }
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_1488 = (fdb_config *)0x110f52;
      fVar1 = fdb_close(pfStack_1478);
      if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00110f56;
      goto LAB_00110fc4;
    }
  }
  else {
    pfStack_1488 = (fdb_config *)0x110fb0;
    large_batch_write_no_commit_test();
LAB_00110fb0:
    pfStack_1488 = (fdb_config *)0x110fb5;
    large_batch_write_no_commit_test();
LAB_00110fb5:
    pfStack_1488 = (fdb_config *)0x110fba;
    large_batch_write_no_commit_test();
LAB_00110fba:
    pfStack_1488 = (fdb_config *)0x110fbf;
    large_batch_write_no_commit_test();
  }
  pfStack_1488 = (fdb_config *)0x110fc4;
  large_batch_write_no_commit_test();
LAB_00110fc4:
  pfStack_1488 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_1498 = pcVar6;
  pfStack_1490 = pfVar4;
  pfStack_1488 = __ptr;
  gettimeofday(&tStack_16b8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1690.wal_threshold = 0x400;
  fStack_1690.seqtree_opt = '\x01';
  fStack_1690.purging_interval = 1;
  fStack_1690.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_16c0,"./dummy1",&fStack_1690);
  fdb_kvs_open(pfStack_16c0,&pfStack_16c8,"db1",&fStack_16a8);
  sprintf(acStack_1598,"key%d",0);
  sVar3 = strlen(acStack_1598);
  fdb_doc_create(&pfStack_16d0,acStack_1598,sVar3,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_16c8,pfStack_16d0);
  fVar1 = fdb_get(pfStack_16c8,pfStack_16d0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_byoffset(pfStack_16c8,pfStack_16d0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_get_metaonly(pfStack_16c8,pfStack_16d0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_get_metaonly_byseq(pfStack_16c8,pfStack_16d0);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_16c8,pfStack_16d0);
        fVar1 = fdb_get(pfStack_16c8,pfStack_16d0);
        if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_16d0->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar1 = fdb_get_metaonly(pfStack_16c8,pfStack_16d0);
          if (fVar1 == FDB_RESULT_SUCCESS) {
            if (pfStack_16d0->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar1 = fdb_get_metaonly_byseq(pfStack_16c8,pfStack_16d0);
            if (fVar1 == FDB_RESULT_SUCCESS) {
              if (pfStack_16d0->deleted != false) {
                fVar1 = fdb_get_byoffset(pfStack_16c8,pfStack_16d0);
                if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_16d0->deleted != false) {
                    fdb_doc_free(pfStack_16d0);
                    fdb_kvs_close(pfStack_16c8);
                    fdb_close(pfStack_16c0);
                    fdb_shutdown();
                    memleak_end();
                    pcVar6 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar6 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar6,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void config_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    int nfiles = 4;
    int i;
    size_t bcache_space_used;
    char fname[256];

    // remove previous dummy test files
    int r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    bcache_space_used = fdb_get_buffer_cache_used();
    TEST_CHK(bcache_space_used == 0);

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size= (uint64_t) -1;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_TOO_BIG_BUFFER_CACHE);

    fconfig = fdb_get_default_config();
    fconfig.max_writer_lock_prob = 120;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    for (i = nfiles; i; --i) {
        sprintf(fname, "dummy%d", i);
        status = fdb_open(&dbfile, fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        bcache_space_used = fdb_get_buffer_cache_used();

        fdb_file_info finfo;
        status = fdb_get_file_info(dbfile, &finfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Since V3 magic number, 7 blocks are used:
        // 4 superblocks + KV name header + Stale-tree root node + DB header
        TEST_CHK(finfo.file_size == fconfig.blocksize * 7);
        // Buffercache must only have KV name header + stale-tree root
        TEST_CHK(bcache_space_used == fconfig.blocksize * 2);

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_open(&dbfile, fname, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(db, (void*)"key", 3, (void*)"body", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    bcache_space_used = fdb_get_buffer_cache_used();

    // Since V3 magic number, 8 blocks are used:
    // 7 blocks created eariler + document block for KV pair
    TEST_CHK(bcache_space_used == fconfig.blocksize * 8);

    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("forestdb config test");
}